

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,CompareExpr *expr)

{
  Enum EVar1;
  CompareExpr *expr_local;
  CWriter *this_local;
  
  EVar1 = Opcode::operator_cast_to_Enum(&expr->opcode);
  switch(EVar1) {
  case I32Eq:
  case I64Eq:
  case F32Eq:
  case F64Eq:
    WriteInfixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"==",Disallowed);
    break;
  case I32Ne:
  case I64Ne:
  case F32Ne:
  case F64Ne:
    WriteInfixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"!=",Disallowed);
    break;
  case I32LtS:
  case I64LtS:
    WriteSignedBinaryExpr(this,(Opcode)(expr->opcode).enum_,"<");
    break;
  case I32LtU:
  case I64LtU:
  case F32Lt:
  case F64Lt:
    WriteInfixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"<",Disallowed);
    break;
  case I32GtS:
  case I64GtS:
    WriteSignedBinaryExpr(this,(Opcode)(expr->opcode).enum_,">");
    break;
  case I32GtU:
  case I64GtU:
  case F32Gt:
  case F64Gt:
    WriteInfixBinaryExpr(this,(Opcode)(expr->opcode).enum_,">",Disallowed);
    break;
  case I32LeS:
  case I64LeS:
    WriteSignedBinaryExpr(this,(Opcode)(expr->opcode).enum_,"<=");
    break;
  case I32LeU:
  case I64LeU:
  case F32Le:
  case F64Le:
    WriteInfixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"<=",Disallowed);
    break;
  case I32GeS:
  case I64GeS:
    WriteSignedBinaryExpr(this,(Opcode)(expr->opcode).enum_,">=");
    break;
  case I32GeU:
  case I64GeU:
  case F32Ge:
  case F64Ge:
    WriteInfixBinaryExpr(this,(Opcode)(expr->opcode).enum_,">=",Disallowed);
    break;
  default:
    abort();
  case I8X16Eq:
    WritePrefixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_i8x16_eq");
    break;
  case I8X16Ne:
    WritePrefixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_i8x16_ne");
    break;
  case I8X16LtS:
    WritePrefixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_i8x16_lt");
    break;
  case I8X16LtU:
    WritePrefixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_u8x16_lt");
    break;
  case I8X16GtS:
    WritePrefixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_i8x16_gt");
    break;
  case I8X16GtU:
    WritePrefixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_u8x16_gt");
    break;
  case I8X16LeS:
    WritePrefixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_i8x16_le");
    break;
  case I8X16LeU:
    WritePrefixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_u8x16_le");
    break;
  case I8X16GeS:
    WritePrefixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_i8x16_ge");
    break;
  case I8X16GeU:
    WritePrefixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_u8x16_ge");
    break;
  case I16X8Eq:
    WritePrefixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_i16x8_eq");
    break;
  case I16X8Ne:
    WritePrefixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_i16x8_ne");
    break;
  case I16X8LtS:
    WritePrefixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_i16x8_lt");
    break;
  case I16X8LtU:
    WritePrefixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_u16x8_lt");
    break;
  case I16X8GtS:
    WritePrefixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_i16x8_gt");
    break;
  case I16X8GtU:
    WritePrefixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_u16x8_gt");
    break;
  case I16X8LeS:
    WritePrefixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_i16x8_le");
    break;
  case I16X8LeU:
    WritePrefixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_u16x8_le");
    break;
  case I16X8GeS:
    WritePrefixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_i16x8_ge");
    break;
  case I16X8GeU:
    WritePrefixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_u16x8_ge");
    break;
  case I32X4Eq:
    WritePrefixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_i32x4_eq");
    break;
  case I32X4Ne:
    WritePrefixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_i32x4_ne");
    break;
  case I32X4LtS:
    WritePrefixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_i32x4_lt");
    break;
  case I32X4LtU:
    WritePrefixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_u32x4_lt");
    break;
  case I32X4GtS:
    WritePrefixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_i32x4_gt");
    break;
  case I32X4GtU:
    WritePrefixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_u32x4_gt");
    break;
  case I32X4LeS:
    WritePrefixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_i32x4_le");
    break;
  case I32X4LeU:
    WritePrefixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_u32x4_le");
    break;
  case I32X4GeS:
    WritePrefixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_i32x4_ge");
    break;
  case I32X4GeU:
    WritePrefixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_u32x4_ge");
    break;
  case F32X4Eq:
    WritePrefixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_f32x4_eq");
    break;
  case F32X4Ne:
    WritePrefixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_f32x4_ne");
    break;
  case F32X4Lt:
    WritePrefixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_f32x4_lt");
    break;
  case F32X4Gt:
    WritePrefixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_f32x4_gt");
    break;
  case F32X4Le:
    WritePrefixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_f32x4_le");
    break;
  case F32X4Ge:
    WritePrefixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_f32x4_ge");
    break;
  case F64X2Eq:
    WritePrefixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_f64x2_eq");
    break;
  case F64X2Ne:
    WritePrefixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_f64x2_ne");
    break;
  case F64X2Lt:
    WritePrefixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_f64x2_lt");
    break;
  case F64X2Gt:
    WritePrefixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_f64x2_gt");
    break;
  case F64X2Le:
    WritePrefixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_f64x2_le");
    break;
  case F64X2Ge:
    WritePrefixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_f64x2_ge");
    break;
  case I64X2Eq:
    WritePrefixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_i64x2_eq");
    break;
  case I64X2Ne:
    WritePrefixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_i64x2_ne");
    break;
  case I64X2LtS:
    WritePrefixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_i64x2_lt");
    break;
  case I64X2GtS:
    WritePrefixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_i64x2_gt");
    break;
  case I64X2LeS:
    WritePrefixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_i64x2_le");
    break;
  case I64X2GeS:
    WritePrefixBinaryExpr(this,(Opcode)(expr->opcode).enum_,"simde_wasm_i64x2_ge");
  }
  return;
}

Assistant:

void CWriter::Write(const CompareExpr& expr) {
  switch (expr.opcode) {
    case Opcode::I32Eq:
    case Opcode::I64Eq:
    case Opcode::F32Eq:
    case Opcode::F64Eq:
      WriteInfixBinaryExpr(expr.opcode, "==", AssignOp::Disallowed);
      break;

    case Opcode::I32Ne:
    case Opcode::I64Ne:
    case Opcode::F32Ne:
    case Opcode::F64Ne:
      WriteInfixBinaryExpr(expr.opcode, "!=", AssignOp::Disallowed);
      break;

    case Opcode::I32LtS:
    case Opcode::I64LtS:
      WriteSignedBinaryExpr(expr.opcode, "<");
      break;

    case Opcode::I32LtU:
    case Opcode::I64LtU:
    case Opcode::F32Lt:
    case Opcode::F64Lt:
      WriteInfixBinaryExpr(expr.opcode, "<", AssignOp::Disallowed);
      break;

    case Opcode::I32LeS:
    case Opcode::I64LeS:
      WriteSignedBinaryExpr(expr.opcode, "<=");
      break;

    case Opcode::I32LeU:
    case Opcode::I64LeU:
    case Opcode::F32Le:
    case Opcode::F64Le:
      WriteInfixBinaryExpr(expr.opcode, "<=", AssignOp::Disallowed);
      break;

    case Opcode::I32GtS:
    case Opcode::I64GtS:
      WriteSignedBinaryExpr(expr.opcode, ">");
      break;

    case Opcode::I32GtU:
    case Opcode::I64GtU:
    case Opcode::F32Gt:
    case Opcode::F64Gt:
      WriteInfixBinaryExpr(expr.opcode, ">", AssignOp::Disallowed);
      break;

    case Opcode::I32GeS:
    case Opcode::I64GeS:
      WriteSignedBinaryExpr(expr.opcode, ">=");
      break;

    case Opcode::I32GeU:
    case Opcode::I64GeU:
    case Opcode::F32Ge:
    case Opcode::F64Ge:
      WriteInfixBinaryExpr(expr.opcode, ">=", AssignOp::Disallowed);
      break;

    case Opcode::I8X16Eq:
      WritePrefixBinaryExpr(expr.opcode, "simde_wasm_i8x16_eq");
      break;

    case Opcode::I8X16GeS:
      WritePrefixBinaryExpr(expr.opcode, "simde_wasm_i8x16_ge");
      break;

    case Opcode::I8X16GeU:
      WritePrefixBinaryExpr(expr.opcode, "simde_wasm_u8x16_ge");
      break;

    case Opcode::I8X16GtS:
      WritePrefixBinaryExpr(expr.opcode, "simde_wasm_i8x16_gt");
      break;

    case Opcode::I8X16GtU:
      WritePrefixBinaryExpr(expr.opcode, "simde_wasm_u8x16_gt");
      break;

    case Opcode::I8X16LeS:
      WritePrefixBinaryExpr(expr.opcode, "simde_wasm_i8x16_le");
      break;

    case Opcode::I8X16LeU:
      WritePrefixBinaryExpr(expr.opcode, "simde_wasm_u8x16_le");
      break;

    case Opcode::I8X16LtS:
      WritePrefixBinaryExpr(expr.opcode, "simde_wasm_i8x16_lt");
      break;

    case Opcode::I8X16LtU:
      WritePrefixBinaryExpr(expr.opcode, "simde_wasm_u8x16_lt");
      break;

    case Opcode::I8X16Ne:
      WritePrefixBinaryExpr(expr.opcode, "simde_wasm_i8x16_ne");
      break;

    case Opcode::I16X8Eq:
      WritePrefixBinaryExpr(expr.opcode, "simde_wasm_i16x8_eq");
      break;

    case Opcode::I16X8GeS:
      WritePrefixBinaryExpr(expr.opcode, "simde_wasm_i16x8_ge");
      break;

    case Opcode::I16X8GeU:
      WritePrefixBinaryExpr(expr.opcode, "simde_wasm_u16x8_ge");
      break;

    case Opcode::I16X8GtS:
      WritePrefixBinaryExpr(expr.opcode, "simde_wasm_i16x8_gt");
      break;
    case Opcode::I16X8GtU:
      WritePrefixBinaryExpr(expr.opcode, "simde_wasm_u16x8_gt");
      break;

    case Opcode::I16X8LeS:
      WritePrefixBinaryExpr(expr.opcode, "simde_wasm_i16x8_le");
      break;

    case Opcode::I16X8LeU:
      WritePrefixBinaryExpr(expr.opcode, "simde_wasm_u16x8_le");
      break;

    case Opcode::I16X8LtS:
      WritePrefixBinaryExpr(expr.opcode, "simde_wasm_i16x8_lt");
      break;

    case Opcode::I16X8LtU:
      WritePrefixBinaryExpr(expr.opcode, "simde_wasm_u16x8_lt");
      break;

    case Opcode::I16X8Ne:
      WritePrefixBinaryExpr(expr.opcode, "simde_wasm_i16x8_ne");
      break;

    case Opcode::I32X4Eq:
      WritePrefixBinaryExpr(expr.opcode, "simde_wasm_i32x4_eq");
      break;

    case Opcode::I32X4GeS:
      WritePrefixBinaryExpr(expr.opcode, "simde_wasm_i32x4_ge");
      break;

    case Opcode::I32X4GeU:
      WritePrefixBinaryExpr(expr.opcode, "simde_wasm_u32x4_ge");
      break;

    case Opcode::I32X4GtS:
      WritePrefixBinaryExpr(expr.opcode, "simde_wasm_i32x4_gt");
      break;

    case Opcode::I32X4GtU:
      WritePrefixBinaryExpr(expr.opcode, "simde_wasm_u32x4_gt");
      break;

    case Opcode::I32X4LeS:
      WritePrefixBinaryExpr(expr.opcode, "simde_wasm_i32x4_le");
      break;

    case Opcode::I32X4LeU:
      WritePrefixBinaryExpr(expr.opcode, "simde_wasm_u32x4_le");
      break;

    case Opcode::I32X4LtS:
      WritePrefixBinaryExpr(expr.opcode, "simde_wasm_i32x4_lt");
      break;

    case Opcode::I32X4LtU:
      WritePrefixBinaryExpr(expr.opcode, "simde_wasm_u32x4_lt");
      break;

    case Opcode::I32X4Ne:
      WritePrefixBinaryExpr(expr.opcode, "simde_wasm_i32x4_ne");
      break;

    case Opcode::I64X2Eq:
      WritePrefixBinaryExpr(expr.opcode, "simde_wasm_i64x2_eq");
      break;

    case Opcode::I64X2GeS:
      WritePrefixBinaryExpr(expr.opcode, "simde_wasm_i64x2_ge");
      break;

    case Opcode::I64X2GtS:
      WritePrefixBinaryExpr(expr.opcode, "simde_wasm_i64x2_gt");
      break;

    case Opcode::I64X2LeS:
      WritePrefixBinaryExpr(expr.opcode, "simde_wasm_i64x2_le");
      break;

    case Opcode::I64X2LtS:
      WritePrefixBinaryExpr(expr.opcode, "simde_wasm_i64x2_lt");
      break;

    case Opcode::I64X2Ne:
      WritePrefixBinaryExpr(expr.opcode, "simde_wasm_i64x2_ne");
      break;

    case Opcode::F32X4Eq:
      WritePrefixBinaryExpr(expr.opcode, "simde_wasm_f32x4_eq");
      break;

    case Opcode::F32X4Ge:
      WritePrefixBinaryExpr(expr.opcode, "simde_wasm_f32x4_ge");
      break;

    case Opcode::F32X4Gt:
      WritePrefixBinaryExpr(expr.opcode, "simde_wasm_f32x4_gt");
      break;

    case Opcode::F32X4Le:
      WritePrefixBinaryExpr(expr.opcode, "simde_wasm_f32x4_le");
      break;

    case Opcode::F32X4Lt:
      WritePrefixBinaryExpr(expr.opcode, "simde_wasm_f32x4_lt");
      break;

    case Opcode::F32X4Ne:
      WritePrefixBinaryExpr(expr.opcode, "simde_wasm_f32x4_ne");
      break;

    case Opcode::F64X2Eq:
      WritePrefixBinaryExpr(expr.opcode, "simde_wasm_f64x2_eq");
      break;

    case Opcode::F64X2Ge:
      WritePrefixBinaryExpr(expr.opcode, "simde_wasm_f64x2_ge");
      break;

    case Opcode::F64X2Gt:
      WritePrefixBinaryExpr(expr.opcode, "simde_wasm_f64x2_gt");
      break;

    case Opcode::F64X2Le:
      WritePrefixBinaryExpr(expr.opcode, "simde_wasm_f64x2_le");
      break;

    case Opcode::F64X2Lt:
      WritePrefixBinaryExpr(expr.opcode, "simde_wasm_f64x2_lt");
      break;

    case Opcode::F64X2Ne:
      WritePrefixBinaryExpr(expr.opcode, "simde_wasm_f64x2_ne");
      break;

    default:
      WABT_UNREACHABLE;
  }
}